

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O2

bool TestComparisonsF<Counter<unsigned_char,4u>>(void)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  
  uVar1 = 0;
  while (uVar2 = uVar1, uVar2 != 3) {
    bVar3 = 0xf - (char)uVar2;
    iVar7 = 1000;
    bVar4 = 0;
    uVar6 = uVar2 + 1;
    while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
      if ((byte)(bVar3 - bVar4) == 0) goto LAB_00101b3e;
      cVar5 = (char)uVar6;
      if ((((((byte)(bVar3 - cVar5) == 0) || ((byte)(bVar4 - cVar5) == 0)) ||
           ((bVar3 - bVar4 & 8) == 0)) || (((bVar3 - cVar5 & 8) == 0 || ((bVar4 - cVar5 & 8) == 0)))
          ) || (((bVar4 - bVar3 & 8) != 0 ||
                (((cVar5 - bVar3 & 8) != 0 || ((cVar5 - bVar4 & 8) != 0)))))) goto LAB_00101b3e;
      bVar3 = bVar3 + 1 & 0xf;
      bVar4 = bVar4 + 1 & 0xf;
      uVar6 = (uint)(cVar5 + 1U & 0xf);
    }
    iVar7 = 2000;
    while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, uVar1 = uVar2 + 1, bVar8) {
      if ((byte)(bVar3 - bVar4) == 0) goto LAB_00101b3e;
      cVar5 = (char)uVar6;
      if (((((byte)(bVar3 - cVar5) == 0) || ((byte)(bVar4 - cVar5) == 0)) ||
          ((bVar3 - bVar4 & 8) == 0)) ||
         ((((bVar3 - cVar5 & 8) == 0 || ((bVar4 - cVar5 & 8) == 0)) ||
          (((bVar4 - bVar3 & 8) != 0 || (((cVar5 - bVar3 & 8) != 0 || ((cVar5 - bVar4 & 8) != 0)))))
          ))) goto LAB_00101b3e;
      bVar3 = bVar3 - 1 & 0xf;
      bVar4 = bVar4 - 1 & 0xf;
      uVar6 = (uint)(cVar5 - 1U & 0xf);
    }
  }
LAB_00101b3e:
  return 2 < uVar2;
}

Assistant:

bool TestComparisonsF()
{
    CounterT a = 2, b = 2, c = 3;
    TEST_CHECK(a == b);
    TEST_CHECK(b != c);
    b = c;
    TEST_CHECK(b == c);
    TEST_CHECK(a != b);

    for (unsigned sep = 0; sep < 3; ++sep)
    {
        a = CounterT::kMask - sep;
        b = 0;
        c = 1 + sep;

        for (unsigned ii = 0; ii < 1000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a++;
            ++b;
            c++;
        }

        for (unsigned ii = 0; ii < 2000; ++ii)
        {
            TEST_CHECK(a == a);
            TEST_CHECK(b == b);
            TEST_CHECK(c == c);
            TEST_CHECK(a != b);
            TEST_CHECK(a != c);
            TEST_CHECK(b != a);
            TEST_CHECK(b != c);
            TEST_CHECK(c != a);
            TEST_CHECK(c != b);

            TEST_CHECK(a < b);
            TEST_CHECK(a < c);
            TEST_CHECK(b < c);
            TEST_CHECK(a <= b);
            TEST_CHECK(a <= c);
            TEST_CHECK(b <= c);
            TEST_CHECK(a <= a);
            TEST_CHECK(b <= b);
            TEST_CHECK(c <= c);

            TEST_CHECK(b > a);
            TEST_CHECK(c > a);
            TEST_CHECK(c > b);
            TEST_CHECK(b >= a);
            TEST_CHECK(c >= a);
            TEST_CHECK(c >= b);
            TEST_CHECK(a >= a);
            TEST_CHECK(b >= b);
            TEST_CHECK(c >= c);

            a--;
            --b;
            c--;
        }
    }

    return true;
}